

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O2

void __thiscall
mini_bus::
NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::reset(NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this)

{
  exception_ptr local_20;
  
  std::mutex::lock(&this->mtx);
  std::
  _Optional_payload_base<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_reset((_Optional_payload_base<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&this->value);
  local_20._M_exception_object = (void *)0x0;
  std::__exception_ptr::exception_ptr::operator=(&this->ex,&local_20);
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_20);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

inline void reset() {
    std::lock_guard lock{mtx};
    value.reset();
    ex = nullptr;
  }